

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_vm.c
# Opt level: O1

_Bool gravity_vm_runclosure
                (gravity_vm *vm,gravity_closure_t *closure,gravity_value_t sender,
                gravity_value_t *params,uint16_t nparams)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long *plVar3;
  ushort uVar4;
  ushort uVar5;
  gravity_exec_type gVar6;
  gravity_function_t *pgVar7;
  gravity_fiber_t *fiber;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar8;
  gravity_function_t *pgVar9;
  undefined8 uVar10;
  _Bool _Var11;
  uint uVar12;
  uint32_t uVar13;
  uint uVar14;
  gravity_callframe_t *pgVar15;
  gravity_value_t *pgVar16;
  long lVar17;
  gravity_list_t *pgVar18;
  bool bVar19;
  uint uVar20;
  uint32_t uVar21;
  gravity_upvalue_t *pgVar22;
  uint uVar23;
  gravity_class_t *pgVar24;
  ulong uVar25;
  gravity_callframe_t *pgVar26;
  long lVar27;
  gravity_callframe_t *pgVar28;
  ulong uVar29;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar30;
  gravity_value_t *pgVar31;
  gravity_value_t gVar32;
  gravity_value_t *local_68;
  uint32_t *local_48;
  
  pgVar24 = sender.isa;
  if ((closure == (gravity_closure_t *)0x0 || vm == (gravity_vm *)0x0) || (vm->aborted != false)) {
LAB_00133964:
    _Var11 = false;
  }
  else {
    pgVar7 = closure->f;
    if ((pgVar7 != (gravity_function_t *)0x0) && (pgVar7->tag == EXEC_TYPE_NATIVE)) {
      if ((pgVar7->field_9).field_0.bytecode == (uint32_t *)0x0) {
        return true;
      }
      if ((pgVar7->field_9).field_0.ninsts == 0) {
        return true;
      }
    }
    fiber = vm->fiber;
    aVar8 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)closure->context;
    aVar30.n = sender.field_1.n;
    if ((gravity_object_t *)aVar8.n != (gravity_object_t *)0x0) {
      pgVar24 = (aVar8.p)->isa;
      aVar30 = aVar8;
    }
    if (fiber->nframes == 0) {
      uVar23 = nparams + 1;
      gravity_fiber_reassign(fiber,closure,(uint16_t)uVar23);
      pgVar9 = closure->f;
      uVar14 = (uint)pgVar9->nparams;
      if (pgVar9->nparams < uVar23) {
        uVar14 = uVar23;
      }
      local_68 = vm->fiber->stack;
      uVar4 = pgVar9->nlocals;
      uVar5 = pgVar9->ntemps;
      local_68->isa = pgVar24;
      (local_68->field_1).n = (gravity_int_t)aVar30;
      if (nparams != 0) {
        lVar17 = 0;
        do {
          puVar1 = (undefined8 *)((long)&params->isa + lVar17);
          uVar10 = puVar1[1];
          puVar2 = (undefined8 *)((long)&local_68[1].isa + lVar17);
          *puVar2 = *puVar1;
          puVar2[1] = uVar10;
          lVar17 = lVar17 + 0x10;
        } while ((ulong)nparams << 4 != lVar17);
      }
      pgVar28 = fiber->frames;
      local_48 = pgVar28->ip;
      if ((closure->f->tag == EXEC_TYPE_NATIVE) && ((closure->f->field_9).field_0.useargs == true))
      {
        pgVar18 = gravity_list_from_array(vm,(uint)nparams,local_68 + 1);
      }
      else {
        pgVar18 = (gravity_list_t *)0x0;
      }
      uVar29 = (ulong)(uVar14 + (uint)uVar4 + (uint)uVar5);
      pgVar28->args = pgVar18;
      uVar21 = 0;
    }
    else {
      pgVar28 = fiber->frames;
      uVar20 = fiber->nframes - 1;
      local_68 = pgVar28[uVar20].stackstart;
      local_48 = pgVar28[uVar20].ip;
      pgVar9 = (pgVar28[uVar20].closure)->f;
      uVar14._0_2_ = pgVar9->nparams;
      uVar14._2_2_ = pgVar9->nlocals;
      uVar23 = *(uint *)&pgVar28[uVar20].nargs;
      if ((ushort)*(uint *)&pgVar28[uVar20].nargs < (ushort)(undefined2)uVar14) {
        uVar23 = uVar14;
      }
      uVar21 = (uint)pgVar9->ntemps + (uint)pgVar9->nlocals + (uVar23 & 0xffff);
      uVar23 = nparams + 1;
      uVar14 = (uint)pgVar7->nparams;
      if (pgVar7->nparams < uVar23) {
        uVar14 = uVar23;
      }
      uVar25 = (long)((long)local_68 +
                     (((ulong)(uVar21 * 0x10) +
                      (ulong)((uint)pgVar7->ntemps + (uint)pgVar7->nlocals + uVar14) * 0x10) -
                     (long)fiber->stacktop)) >> 4;
      uVar29 = 0;
      if (0 < (long)uVar25) {
        uVar29 = uVar25;
      }
      bVar19 = true;
      if ((int)uVar29 != 0) {
        pgVar16 = fiber->stacktop + (uVar29 & 0xffffffff);
        fiber->stacktop = pgVar16;
        pgVar31 = fiber->stack;
        uVar12 = (uint)((ulong)((long)pgVar16 - (long)pgVar31) >> 4);
        uVar14 = 0x100;
        if (0x100 < uVar12) {
          uVar14 = uVar12;
        }
        if (fiber->stackalloc < uVar14) {
          uVar13 = power_of2_ceil(fiber->stackalloc + uVar14);
          if (uVar13 == 0) {
            pgVar16 = (gravity_value_t *)0x0;
          }
          else if (uVar13 < uVar14 + fiber->stackalloc) {
            pgVar16 = (gravity_value_t *)0x0;
          }
          else {
            pgVar16 = (gravity_value_t *)
                      gravity_realloc((gravity_vm *)0x0,fiber->stack,(ulong)uVar13 << 4);
          }
          bVar19 = true;
          if (pgVar16 == (gravity_value_t *)0x0) {
            fiber->stacktop = fiber->stacktop + -(uVar29 & 0xffffffff);
            bVar19 = false;
          }
          else {
            fiber->stack = pgVar16;
            fiber->stackalloc = uVar13;
            lVar17 = (long)pgVar16 - (long)pgVar31;
            if (lVar17 != 0) {
              uVar14 = fiber->nframes;
              if ((ulong)uVar14 != 0) {
                pgVar26 = fiber->frames;
                lVar27 = 0;
                do {
                  plVar3 = (long *)((long)&pgVar26->stackstart + lVar27);
                  *plVar3 = *plVar3 + lVar17;
                  lVar27 = lVar27 + 0x30;
                } while ((ulong)uVar14 * 0x30 != lVar27);
              }
              for (pgVar22 = fiber->upvalues; pgVar22 != (gravity_upvalue_t *)0x0;
                  pgVar22 = pgVar22->next) {
                pgVar22->value = (gravity_value_t *)((long)pgVar22->value + lVar17);
              }
              fiber->stacktop = (gravity_value_t *)((long)fiber->stacktop + lVar17);
              local_68 = (gravity_value_t *)((long)local_68 + lVar17);
              bVar19 = true;
            }
          }
        }
      }
      pgVar28 = pgVar28 + uVar20;
      if (!bVar19) {
        pgVar28->ip = local_48;
        report_runtime_error
                  (vm,(error_type_t)pgVar28,
                   "Infinite loop detected. Current execution must be aborted.");
        return false;
      }
      uVar25 = (ulong)(uVar21 * 0x10);
      *(gravity_class_t **)((long)&local_68->isa + uVar25) = pgVar24;
      ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)((long)&local_68->field_1 + uVar25))->n =
           (gravity_int_t)aVar30;
      if (nparams != 0) {
        lVar17 = 0;
        do {
          puVar1 = (undefined8 *)((long)&params->isa + lVar17);
          uVar10 = puVar1[1];
          puVar2 = (undefined8 *)((long)&local_68[1].isa + lVar17 + (ulong)(uVar21 * 0x10));
          *puVar2 = *puVar1;
          puVar2[1] = uVar10;
          lVar17 = lVar17 + 0x10;
        } while ((ulong)nparams << 4 != lVar17);
      }
      pgVar28->ip = local_48;
      if (fiber->framesalloc == fiber->nframes) {
        uVar14 = fiber->framesalloc * 2;
        pgVar26 = fiber->frames;
        pgVar15 = (gravity_callframe_t *)
                  gravity_realloc((gravity_vm *)0x0,pgVar26,(ulong)uVar14 * 0x30);
        if (pgVar15 != (gravity_callframe_t *)0x0) {
          fiber->frames = pgVar15;
          fiber->framesalloc = uVar14;
          goto LAB_00133dc1;
        }
        report_runtime_error
                  (vm,(error_type_t)pgVar26,
                   "Infinite loop detected. Current execution must be aborted.");
        pgVar26 = (gravity_callframe_t *)0x0;
      }
      else {
LAB_00133dc1:
        uVar14 = fiber->nframes;
        fiber->nframes = uVar14 + 1;
        pgVar26 = fiber->frames + uVar14;
      }
      if (pgVar26 == (gravity_callframe_t *)0x0) goto LAB_00133964;
      pgVar31 = (gravity_value_t *)((long)&local_68->isa + uVar25);
      pgVar26->closure = closure;
      pgVar26->stackstart = pgVar31;
      pgVar9 = closure->f;
      pgVar26->ip = (pgVar9->field_9).field_0.bytecode;
      pgVar26->dest = uVar21;
      pgVar26->nargs = (uint16_t)uVar23;
      pgVar26->outloop = false;
      if ((pgVar9->tag == EXEC_TYPE_NATIVE) && ((pgVar9->field_9).field_0.useargs == true)) {
        pgVar18 = gravity_list_from_array(vm,(uint)nparams,pgVar31 + 1);
      }
      else {
        pgVar18 = (gravity_list_t *)0x0;
      }
      pgVar26->args = pgVar18;
      pgVar26->outloop = true;
    }
    gVar6 = pgVar7->tag;
    if (gVar6 == EXEC_TYPE_BRIDGED) {
      if (vm->delegate->bridge_execute == (gravity_bridge_execute)0x0) {
        _Var11 = false;
      }
      else {
        gravity_gc_setenabled(vm,false);
        gVar32.field_1.n = aVar30.n;
        gVar32.isa = pgVar24;
        _Var11 = (*vm->delegate->bridge_execute)
                           (vm,pgVar7->xdata,gVar32,
                            (gravity_value_t *)((long)&local_68->isa + (ulong)(uVar21 << 4)),nparams
                            ,0xfffffffe);
        gravity_gc_setenabled(vm,true);
      }
    }
    else if (gVar6 == EXEC_TYPE_INTERNAL) {
      gravity_gc_setenabled(vm,false);
      _Var11 = (*(pgVar7->field_9).internal)
                         (vm,(gravity_value_t *)((long)&local_68->isa + (ulong)(uVar21 << 4)),
                          nparams,0xfffffffe);
      gravity_gc_setenabled(vm,true);
    }
    else if (gVar6 == EXEC_TYPE_NATIVE) {
      uVar14 = vm->nccalls + 1;
      vm->nccalls = uVar14;
      if (vm->maxccalls < uVar14) {
        pgVar28->ip = local_48;
        report_runtime_error
                  (vm,(error_type_t)pgVar28,"Maximum number of nested C calls reached (%d).");
        return false;
      }
      _Var11 = gravity_vm_exec(vm);
      vm->nccalls = vm->nccalls - 1;
    }
    else {
      _Var11 = false;
    }
    if (fiber == vm->fiber) {
      if (pgVar7->tag != EXEC_TYPE_NATIVE) {
        fiber->nframes = fiber->nframes - 1;
      }
      fiber->stacktop = fiber->stacktop + -(uVar29 & 0xffffffff);
    }
  }
  return _Var11;
}

Assistant:

bool gravity_vm_runclosure (gravity_vm *vm, gravity_closure_t *closure, gravity_value_t sender, gravity_value_t params[], uint16_t nparams) {
    if (!vm || !closure || vm->aborted) return false;

    // do not waste cycles on empty functions
    gravity_function_t *f = closure->f;
    if (f && (f->tag == EXEC_TYPE_NATIVE) && ((!f->bytecode) || (f->ninsts == 0))) return true;

    // current execution fiber
    gravity_fiber_t     *fiber = vm->fiber;
    gravity_value_t     *stackstart = NULL;
    uint32_t            rwin = 0;
	uint32_t			stacktopdelta = 0;
    
    // current frame and current instruction pointer
    gravity_callframe_t *frame;
    uint32_t            *ip;
	
    DEBUG_STACK();

    // self value is default to the context where the closure has been created (or set by the user)
    gravity_value_t selfvalue;

    // MSVC bug: designated initializer was prematurely evaluated
    if (closure->context) selfvalue = VALUE_FROM_OBJECT(closure->context);
    else selfvalue = sender;
    
    // we need a way to give user the ability to access the sender value from a closure
    
    // if fiber->nframes is not zero it means that this event has been recursively called
    // from somewhere inside the main function so we need to protect and correctly setup
    // the new activation frame
    if (fiber->nframes) {
        // current call frame
        frame = &fiber->frames[fiber->nframes - 1];

        // current top of the stack
        stackstart = frame->stackstart;

        // current instruction pointer
        ip = frame->ip;

        // compute register window
        rwin = FN_COUNTREG(frame->closure->f, frame->nargs);

        // check stack size
        uint32_t _rneed = FN_COUNTREG(f,nparams+1);
		stacktopdelta = (uint32_t)MAXNUM(stackstart + rwin + _rneed - vm->fiber->stacktop, 0);
        if (!gravity_check_stack(vm, vm->fiber, stacktopdelta, &stackstart)) {
            RUNTIME_ERROR("Infinite loop detected. Current execution must be aborted.");
        }
		
        // setup params (first param is self)
        SETVALUE(rwin, selfvalue);
        for (uint16_t i=0; i<nparams; ++i) {
            SETVALUE(rwin+i+1, params[i]);
        }

        STORE_FRAME();
        PUSH_FRAME(closure, &stackstart[rwin], rwin, nparams+1);
        SETFRAME_OUTLOOP(cframe);
    } else {
        // there are no execution frames when called outside main function
        gravity_fiber_reassign(vm->fiber, closure, nparams+1);
        stackstart = vm->fiber->stack;
		stacktopdelta = FN_COUNTREG(closure->f, nparams+1);
		
        // setup params (first param is self)
        SETVALUE(rwin, selfvalue);
        for (uint16_t i=0; i<nparams; ++i) {
            SETVALUE(rwin+i+1, params[i]);
        }

        // check if closure uses the special _args instruction
        frame = &fiber->frames[0];
        ip = frame->ip;
        frame->args = (USE_ARGS(closure)) ? gravity_list_from_array(vm, nparams, &stackstart[rwin]+1) : NULL;
    }

    // f can be native, internal or bridge because this function
    // is called also by convert_value2string
    // for example in Creo:
    // var mData = Data();
    // Console.write("data: " + mData);
    // mData.String is a bridged objc method
    DEBUG_STACK();

    bool result = false;
    switch (f->tag) {
        case EXEC_TYPE_NATIVE:
            ++vm->nccalls;
            if (vm->nccalls > vm->maxccalls) RUNTIME_ERROR("Maximum number of nested C calls reached (%d).", vm->maxccalls);
            result = gravity_vm_exec(vm);
            --vm->nccalls;
            break;

        case EXEC_TYPE_INTERNAL:
            BEGIN_TRUST_USERCODE(vm);
            result = f->internal(vm, &stackstart[rwin], nparams, GRAVITY_FIBER_REGISTER);
            END_TRUST_USERCODE(vm);
            break;

        case EXEC_TYPE_BRIDGED:
            if (vm->delegate->bridge_execute) {
                BEGIN_TRUST_USERCODE(vm);
                result = vm->delegate->bridge_execute(vm, f->xdata, selfvalue, &stackstart[rwin], nparams, GRAVITY_FIBER_REGISTER);
                END_TRUST_USERCODE(vm);
            }
            break;

        case EXEC_TYPE_SPECIAL:
            result = false;
            break;
    }
    
    if (fiber == vm->fiber) {
        // fix pointers ONLY if fiber remains the same
        if (f->tag != EXEC_TYPE_NATIVE) --fiber->nframes;
        fiber->stacktop -= stacktopdelta;
    }
	
    DEBUG_STACK();
    return result;
}